

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O3

void __thiscall
EnvironmentNAV2D::GetSuccsofChangedEdges
          (EnvironmentNAV2D *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *succs_of_changededgesIDV)

{
  sbpl_2Dcell_t sVar1;
  iterator iVar2;
  int iVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int local_40;
  int local_3c;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *local_38;
  
  psVar4 = (changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 3;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    local_38 = changedcellsV;
    do {
      if (uVar6 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      sVar1 = psVar4[uVar8];
      local_3c = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x28])
                           (this,(ulong)sVar1 & 0xffffffff,(ulong)sVar1 >> 0x20);
      iVar2._M_current =
           (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (succs_of_changededgesIDV,iVar2,&local_3c);
      }
      else {
        *iVar2._M_current = local_3c;
        (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar3 = (this->EnvNAV2DCfg).numofdirs;
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          iVar7 = (this->EnvNAV2DCfg).dx_[lVar9] + sVar1.x;
          if ((-1 < iVar7) && (iVar7 < (this->EnvNAV2DCfg).EnvWidth_c)) {
            iVar7 = (this->EnvNAV2DCfg).dy_[lVar9] + sVar1.y;
            if ((-1 < iVar7) && (iVar7 < (this->EnvNAV2DCfg).EnvHeight_c)) {
              local_40 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation
                           [0x28])(this);
              iVar2._M_current =
                   (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (succs_of_changededgesIDV,iVar2,&local_40);
              }
              else {
                *iVar2._M_current = local_40;
                (succs_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
              iVar3 = (this->EnvNAV2DCfg).numofdirs;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar3);
      }
      uVar8 = uVar8 + 1;
      psVar4 = (local_38->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar5 = (long)(local_38->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
      uVar6 = (long)uVar5 >> 3;
    } while ((long)uVar8 < (long)(int)(uVar5 >> 3));
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetSuccsofChangedEdges(vector<nav2dcell_t> const * changedcellsV,
                                              vector<int> *succs_of_changededgesIDV)
{
    nav2dcell_t cell;
    int aind;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);
        succs_of_changededgesIDV->push_back(GetStateFromCoord(cell.x, cell.y));
        for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
            int affx = cell.x + EnvNAV2DCfg.dx_[aind];
            int affy = cell.y + EnvNAV2DCfg.dy_[aind];
            if (affx < 0 || affx >= EnvNAV2DCfg.EnvWidth_c || affy < 0 || affy >= EnvNAV2DCfg.EnvHeight_c) continue;
            succs_of_changededgesIDV->push_back(GetStateFromCoord(affx, affy));
        }
    }
}